

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O0

void __thiscall
CompareTxMemPoolEntryByAncestorFee::GetModFeeAndSize<CTxMemPoolEntry>
          (CompareTxMemPoolEntryByAncestorFee *this,CTxMemPoolEntry *a,double *mod_fee,double *size)

{
  long lVar1;
  int32_t iVar2;
  CAmount CVar3;
  int64_t iVar4;
  double *in_RCX;
  double *in_RDX;
  long in_FS_OFFSET;
  CTxMemPoolEntry *this_00;
  double dVar5;
  double f2;
  double f1;
  CTxMemPoolEntry *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CVar3 = CTxMemPoolEntry::GetModifiedFee(in_stack_ffffffffffffffb8);
  this_00 = (CTxMemPoolEntry *)(double)CVar3;
  iVar4 = CTxMemPoolEntry::GetSizeWithAncestors(this_00);
  dVar5 = (double)this_00 * (double)iVar4;
  CVar3 = CTxMemPoolEntry::GetModFeesWithAncestors(this_00);
  iVar2 = CTxMemPoolEntry::GetTxSize(this_00);
  if (dVar5 <= (double)CVar3 * (double)iVar2) {
    CVar3 = CTxMemPoolEntry::GetModifiedFee(this_00);
    *in_RDX = (double)CVar3;
    iVar2 = CTxMemPoolEntry::GetTxSize(this_00);
    *in_RCX = (double)iVar2;
  }
  else {
    CVar3 = CTxMemPoolEntry::GetModFeesWithAncestors(this_00);
    *in_RDX = (double)CVar3;
    iVar4 = CTxMemPoolEntry::GetSizeWithAncestors(this_00);
    *in_RCX = (double)iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetModFeeAndSize(const T &a, double &mod_fee, double &size) const
    {
        // Compare feerate with ancestors to feerate of the transaction, and
        // return the fee/size for the min.
        double f1 = (double)a.GetModifiedFee() * a.GetSizeWithAncestors();
        double f2 = (double)a.GetModFeesWithAncestors() * a.GetTxSize();

        if (f1 > f2) {
            mod_fee = a.GetModFeesWithAncestors();
            size = a.GetSizeWithAncestors();
        } else {
            mod_fee = a.GetModifiedFee();
            size = a.GetTxSize();
        }
    }